

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

xmlEnumerationPtr xmlCopyEnumeration(xmlEnumerationPtr cur)

{
  xmlEnumerationPtr pxVar1;
  xmlEnumerationPtr pxVar2;
  xmlEnumerationPtr cur_00;
  xmlEnumerationPtr pxVar3;
  
  cur_00 = (xmlEnumerationPtr)0x0;
  pxVar3 = (xmlEnumerationPtr)0x0;
  while( true ) {
    if (cur == (xmlEnumerationPtr)0x0) {
      return cur_00;
    }
    pxVar1 = xmlCreateEnumeration(cur->name);
    if (pxVar1 == (xmlEnumerationPtr)0x0) break;
    pxVar2 = pxVar1;
    if (cur_00 != (xmlEnumerationPtr)0x0) {
      pxVar3->next = pxVar1;
      pxVar2 = cur_00;
    }
    cur = cur->next;
    cur_00 = pxVar2;
    pxVar3 = pxVar1;
  }
  xmlFreeEnumeration(cur_00);
  return (xmlEnumerationPtr)0x0;
}

Assistant:

xmlEnumerationPtr
xmlCopyEnumeration(xmlEnumerationPtr cur) {
    xmlEnumerationPtr ret = NULL;
    xmlEnumerationPtr last = NULL;

    while (cur != NULL) {
        xmlEnumerationPtr copy = xmlCreateEnumeration(cur->name);

        if (copy == NULL) {
            xmlFreeEnumeration(ret);
            return(NULL);
        }

        if (ret == NULL) {
            ret = last = copy;
        } else {
            last->next = copy;
            last = copy;
        }

        cur = cur->next;
    }

    return(ret);
}